

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O2

int ASN1_STRING_cmp(ASN1_STRING *a,ASN1_STRING *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint8_t b_padding;
  uint8_t a_padding;
  
  iVar1 = a->length;
  iVar2 = b->length;
  a_padding = '\0';
  b_padding = '\0';
  if (a->type == 3) {
    iVar1 = asn1_bit_string_length((ASN1_BIT_STRING *)a,&a_padding);
  }
  if (b->type == 3) {
    iVar2 = asn1_bit_string_length((ASN1_BIT_STRING *)b,&b_padding);
  }
  uVar4 = 0xffffffff;
  uVar3 = uVar4;
  if ((((iVar2 <= iVar1) && (uVar3 = 1, iVar1 <= iVar2)) &&
      (uVar3 = uVar4, b_padding > a_padding || a_padding == b_padding)) &&
     ((uVar3 = 1, b_padding <= a_padding &&
      ((iVar1 == 0 || (uVar3 = memcmp(a->data,b->data,(long)iVar1), uVar3 == 0)))))) {
    uVar3 = uVar4;
    if (b->type <= a->type) {
      uVar3 = (uint)(b->type < a->type);
    }
  }
  return uVar3;
}

Assistant:

int ASN1_STRING_cmp(const ASN1_STRING *a, const ASN1_STRING *b) {
  // Capture padding bits and implicit truncation in BIT STRINGs.
  int a_length = a->length, b_length = b->length;
  uint8_t a_padding = 0, b_padding = 0;
  if (a->type == V_ASN1_BIT_STRING) {
    a_length = asn1_bit_string_length(a, &a_padding);
  }
  if (b->type == V_ASN1_BIT_STRING) {
    b_length = asn1_bit_string_length(b, &b_padding);
  }

  if (a_length < b_length) {
    return -1;
  }
  if (a_length > b_length) {
    return 1;
  }
  // In a BIT STRING, the number of bits is 8 * length - padding. Invert this
  // comparison so we compare by lengths.
  if (a_padding > b_padding) {
    return -1;
  }
  if (a_padding < b_padding) {
    return 1;
  }

  int ret = OPENSSL_memcmp(a->data, b->data, a_length);
  if (ret != 0) {
    return ret;
  }

  // Comparing the type first is more natural, but this matches OpenSSL.
  if (a->type < b->type) {
    return -1;
  }
  if (a->type > b->type) {
    return 1;
  }
  return 0;
}